

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O1

void dxil_spv::emit_temp_storage_resolve(Impl *impl,Value *real_value,Id temp_storage)

{
  TypeID TVar1;
  Id IVar2;
  Type *pTVar3;
  Operation *this;
  Operation *this_00;
  LoggingCallback p_Var4;
  void *pvVar5;
  char acStack_1028 [4096];
  
  pTVar3 = LLVMBC::Value::getType(real_value);
  TVar1 = LLVMBC::Type::getTypeID(pTVar3);
  if (TVar1 == PointerTyID) {
    pTVar3 = LLVMBC::Type::getPointerElementType(pTVar3);
    IVar2 = Converter::Impl::get_type_id(impl,pTVar3,0);
    this = Converter::Impl::allocate(impl,OpLoad,IVar2);
    Operation::add_id(this,temp_storage);
    Converter::Impl::add(impl,this,false);
    this_00 = Converter::Impl::allocate(impl,OpStore);
    IVar2 = Converter::Impl::get_id_for_value(impl,real_value,0);
    Operation::add_id(this_00,IVar2);
    Operation::add_id(this_00,this->id);
    Converter::Impl::add(impl,this_00,false);
    return;
  }
  p_Var4 = get_thread_log_callback();
  if (p_Var4 == (LoggingCallback)0x0) {
    emit_temp_storage_resolve();
    std::terminate();
  }
  builtin_strncpy(acStack_1028 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1028,"Invalid type ID ",0x10);
  pvVar5 = get_thread_log_callback_userdata();
  (*p_Var4)(pvVar5,Error,acStack_1028);
  std::terminate();
}

Assistant:

static void emit_temp_storage_resolve(Converter::Impl &impl, const llvm::Value *real_value, spv::Id temp_storage)
{
	auto *pointer_type = llvm::cast<llvm::PointerType>(real_value->getType());
	auto *pointee_type = pointer_type->getPointerElementType();
	spv::Id type_id = impl.get_type_id(pointee_type);

	// Load the result from the temp
	auto *load_op = impl.allocate(spv::OpLoad, type_id);
	load_op->add_id(temp_storage);
	impl.add(load_op);

	// Store the result in the alloca'ed value
	auto *store_op = impl.allocate(spv::OpStore);
	store_op->add_id(impl.get_id_for_value(real_value));
	store_op->add_id(load_op->id);
	impl.add(store_op);
}